

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int pk_get_pk_alg(uchar **p,uchar *end,mbedtls_pk_type_t *pk_alg,mbedtls_asn1_buf *params)

{
  int iVar1;
  int iVar2;
  mbedtls_asn1_buf alg_oid;
  mbedtls_asn1_buf mStack_28;
  
  *(undefined8 *)params = 0;
  params->len = 0;
  params->p = (uchar *)0x0;
  iVar1 = mbedtls_asn1_get_alg(p,end,&mStack_28,params);
  if (iVar1 == 0) {
    iVar2 = mbedtls_oid_get_pk_alg(&mStack_28,pk_alg);
    iVar1 = -0x3c80;
    if (iVar2 == 0) {
      if (*pk_alg == MBEDTLS_PK_RSA) {
        if ((params->tag != 5) && (params->tag != 0)) {
          return -0x3a80;
        }
        if (params->len != 0) {
          return -0x3a80;
        }
      }
      iVar1 = 0;
    }
  }
  else {
    iVar1 = iVar1 + -0x3a80;
  }
  return iVar1;
}

Assistant:

static int pk_get_pk_alg( unsigned char **p,
                          const unsigned char *end,
                          mbedtls_pk_type_t *pk_alg, mbedtls_asn1_buf *params )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_asn1_buf alg_oid;

    memset( params, 0, sizeof(mbedtls_asn1_buf) );

    if( ( ret = mbedtls_asn1_get_alg( p, end, &alg_oid, params ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_ALG + ret );

    if( mbedtls_oid_get_pk_alg( &alg_oid, pk_alg ) != 0 )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    /*
     * No parameters with RSA (only for EC)
     */
    if( *pk_alg == MBEDTLS_PK_RSA &&
            ( ( params->tag != MBEDTLS_ASN1_NULL && params->tag != 0 ) ||
                params->len != 0 ) )
    {
        return( MBEDTLS_ERR_PK_INVALID_ALG );
    }

    return( 0 );
}